

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPELinker.cxx
# Opt level: O2

bool __thiscall
cmBinUtilsWindowsPELinker::ScanDependencies
          (cmBinUtilsWindowsPELinker *this,string *file,TargetType param_2)

{
  cmRuntimeDependencyArchive *this_00;
  bool bVar1;
  int iVar2;
  WinPEDependency *__result;
  pointer pWVar3;
  WinPEDependency *pWVar4;
  allocator<WinPEDependency> *paVar5;
  size_t __n;
  WinPEDependency *__args;
  WinPEDependency *__args_00;
  size_t __n_00;
  pointer __p;
  pointer pWVar6;
  string *psVar7;
  _Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *this_01;
  _Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *this_02;
  pointer pbVar8;
  long lVar9;
  WinPEDependency *__last;
  bool bVar10;
  bool resolved;
  bool unique;
  vector<WinPEDependency,_std::allocator<WinPEDependency>_> local_118;
  cmBinUtilsWindowsPELinker *local_100;
  WinPEDependency *local_f8;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  needed;
  string origin;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  needed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  needed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  needed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar7 = file;
  local_100 = this;
  iVar2 = (*((this->Tool)._M_t.
             super___uniq_ptr_impl<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
             .super__Head_base<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_false>.
            _M_head_impl)->_vptr_cmBinUtilsWindowsPEGetRuntimeDependenciesTool[2])();
  if ((char)iVar2 == '\0') {
    bVar10 = false;
  }
  else {
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this_01 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
              ((long)needed.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)needed.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    paVar5 = (allocator<WinPEDependency> *)((ulong)this_01 >> 0x39);
    if (paVar5 != (allocator<WinPEDependency> *)0x0) {
      std::__throw_length_error("vector::reserve");
    }
    __result = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    pWVar6 = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
    pbVar8 = needed.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __last = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pWVar3 = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (needed.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        needed.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __result = std::_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>::_M_allocate
                           (this_01,(size_t)psVar7);
      std::
      __uninitialized_copy_a<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency_const*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>
                ((WinPEDependency *)0x0,(WinPEDependency *)0x0,__result,paVar5);
      std::
      _Destroy<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency*>
                ((WinPEDependency *)0x0,(WinPEDependency *)0x0);
      std::_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>::_M_deallocate
                ((_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)0x0,(pointer)0x0
                 ,__n);
      local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __result + (long)this_01;
      this_01 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
                ((long)needed.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)needed.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      pWVar6 = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar8 = needed.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __last = __result;
      pWVar3 = __result;
      local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
      super__Vector_impl_data._M_finish = __result;
    }
    for (; local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
           super__Vector_impl_data._M_start = pWVar3, 0 < (long)this_01;
        this_01 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
                  ((long)&this_01[-1]._M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
      std::__cxx11::string::string((string *)&path,(string *)pbVar8);
      origin._M_dataplus._M_p = (pointer)&origin.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)path._M_dataplus._M_p == &path.field_2) {
        origin.field_2._8_8_ = path.field_2._8_8_;
      }
      else {
        origin._M_dataplus = path._M_dataplus;
      }
      origin.field_2._M_allocated_capacity._1_7_ = path.field_2._M_allocated_capacity._1_7_;
      origin.field_2._M_local_buf[0] = path.field_2._M_local_buf[0];
      origin._M_string_length = path._M_string_length;
      path._M_string_length = 0;
      path.field_2._M_local_buf[0] = '\0';
      psVar7 = &origin;
      path._M_dataplus._M_p = (pointer)&path.field_2;
      cmsys::SystemTools::LowerCase(&local_68,psVar7);
      if (__last == pWVar6) {
        lVar9 = (long)pWVar6 - (long)__result;
        if (lVar9 == 0x7fffffffffffffc0) {
          local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
          super__Vector_impl_data._M_start = __result;
          local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
          super__Vector_impl_data._M_finish = __last;
          local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pWVar6;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)(lVar9 >> 6);
        pWVar3 = __p;
        if (pWVar6 == __result) {
          pWVar3 = (pointer)&DAT_00000001;
        }
        this_02 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
                  ((long)&(pWVar3->Original)._M_dataplus._M_p + (long)__p);
        paVar5 = (allocator<WinPEDependency> *)0x1ffffffffffffff;
        if ((_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)0x1fffffffffffffe <
            this_02) {
          this_02 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
                    0x1ffffffffffffff;
        }
        if (CARRY8((ulong)pWVar3,(ulong)__p)) {
          this_02 = (_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)
                    0x1ffffffffffffff;
        }
        local_f8 = std::_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>::_M_allocate
                             (this_02,(size_t)psVar7);
        std::
        allocator_traits<std::allocator<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>>
        ::
        construct<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>
                  ((allocator_type *)(lVar9 + (long)local_f8),(WinPEDependency *)&origin,__args_00);
        pWVar4 = std::
                 __uninitialized_copy_a<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency_const*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>
                           (__result,__last,local_f8,paVar5);
        pWVar4 = std::
                 __uninitialized_copy_a<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency_const*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency*,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>
                           (__last,__last,pWVar4 + 1,paVar5);
        std::
        _Destroy<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency*>
                  (__result,__last);
        std::_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>::_M_deallocate
                  ((_Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_> *)__result,__p,
                   __n_00);
        pWVar6 = local_f8 + (long)this_02;
        __result = local_f8;
      }
      else {
        std::
        allocator_traits<std::allocator<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>>
        ::
        construct<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency,cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>
                  ((allocator_type *)__last,(WinPEDependency *)&origin,__args);
        pWVar4 = __last + 1;
      }
      ScanDependencies::WinPEDependency::~WinPEDependency((WinPEDependency *)&origin);
      std::__cxx11::string::~string((string *)&path);
      pbVar8 = pbVar8 + 1;
      __last = pWVar4;
      pWVar3 = local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_start = __result;
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_finish = __last;
    local_118.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pWVar6;
    cmsys::SystemTools::GetFilenamePath(&origin,file);
    for (; bVar10 = __result == __last, !bVar10; __result = __result + 1) {
      bVar1 = cmRuntimeDependencyArchive::IsPreExcluded
                        ((local_100->super_cmBinUtilsLinker).Archive,&__result->LowerCase);
      if (!bVar1) {
        path._M_dataplus._M_p = (pointer)&path.field_2;
        path._M_string_length = 0;
        path.field_2._M_local_buf[0] = '\0';
        resolved = false;
        ResolveDependency(local_100,&__result->LowerCase,&origin,&path,&resolved);
        this_00 = (local_100->super_cmBinUtilsLinker).Archive;
        if (resolved == true) {
          bVar1 = cmRuntimeDependencyArchive::IsPostExcluded(this_00,&path);
          if (!bVar1) {
            std::__cxx11::string::replace
                      (&path,(long)(path._M_dataplus._M_p + path._M_string_length) -
                             (__result->Original)._M_string_length,
                       path._M_dataplus._M_p + path._M_string_length,__result);
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmRuntimeDependencyArchive::AddResolvedPath
                      ((local_100->super_cmBinUtilsLinker).Archive,&__result->Original,&path,&unique
                       ,&local_48);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_48);
            if ((unique == true) &&
               (iVar2 = (*(local_100->super_cmBinUtilsLinker)._vptr_cmBinUtilsLinker[3])
                                  (local_100,&path,2), (char)iVar2 == '\0')) {
              std::__cxx11::string::~string((string *)&path);
              break;
            }
          }
        }
        else {
          cmRuntimeDependencyArchive::AddUnresolvedPath(this_00,&__result->Original);
        }
        std::__cxx11::string::~string((string *)&path);
      }
    }
    std::__cxx11::string::~string((string *)&origin);
    std::vector<WinPEDependency,_std::allocator<WinPEDependency>_>::~vector(&local_118);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&needed);
  return bVar10;
}

Assistant:

bool cmBinUtilsWindowsPELinker::ScanDependencies(
  std::string const& file, cmStateEnums::TargetType /* unused */)
{
  std::vector<std::string> needed;
  if (!this->Tool->GetFileInfo(file, needed)) {
    return false;
  }

  struct WinPEDependency
  {
    WinPEDependency(std::string o)
      : Original(std::move(o))
      , LowerCase(cmSystemTools::LowerCase(Original))
    {
    }
    std::string const Original;
    std::string const LowerCase;
  };

  std::vector<WinPEDependency> depends;
  depends.reserve(needed.size());
  std::move(needed.begin(), needed.end(), std::back_inserter(depends));
  std::string origin = cmSystemTools::GetFilenamePath(file);

  for (auto const& lib : depends) {
    if (!this->Archive->IsPreExcluded(lib.LowerCase)) {
      std::string path;
      bool resolved = false;
      if (!this->ResolveDependency(lib.LowerCase, origin, path, resolved)) {
        return false;
      }
      if (resolved) {
        if (!this->Archive->IsPostExcluded(path)) {
#ifdef _WIN32
          ReplaceWithActualNameCasing(path);
#else
          path.replace(path.end() - lib.Original.size(), path.end(),
                       lib.Original);
#endif
          bool unique;
          this->Archive->AddResolvedPath(lib.Original, path, unique);
          if (unique &&
              !this->ScanDependencies(path, cmStateEnums::SHARED_LIBRARY)) {
            return false;
          }
        }
      } else {
        this->Archive->AddUnresolvedPath(lib.Original);
      }
    }
  }

  return true;
}